

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler3>::
ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler3>::ConHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler3> *this,int info)

{
  int num_items;
  int iVar1;
  int iVar2;
  IntSuffixHandler suffix_handler;
  DblSuffixHandler suffix_handler_1;
  IntSuffixHandler local_22;
  DblSuffixHandler local_21;
  
  iVar2 = *(int *)(*(long *)(this + 8) + 4);
  iVar1 = *(int *)(*(long *)(this + 8) + 0x14);
  num_items = iVar1 + iVar2;
  iVar2 = NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::ReadUInt
                    ((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> *)this,1,
                     iVar1 + iVar2 + 1);
  TextReader<fmt::Locale>::ReadName(*(TextReader<fmt::Locale> **)this);
  TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  if ((info & 4U) == 0) {
    ReadSuffixValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler3>::IntReader,mp::NLHandler<TestNLHandler3,int>::IntSuffixHandler>
              (this,iVar2,num_items,&local_22);
  }
  else {
    ReadSuffixValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler3>::DoubleReader,mp::NLHandler<TestNLHandler3,int>::DblSuffixHandler>
              (this,iVar2,num_items,&local_21);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadSuffix(int info) {
  int num_items = ItemInfo(*this).num_items();
  int num_values = ReadUInt(1, num_items + 1);
  fmt::StringRef name = reader_.ReadName();
  reader_.ReadTillEndOfLine();
  suf::Kind kind = static_cast<suf::Kind>(info & internal::SUFFIX_KIND_MASK);
  if ((info & suf::FLOAT) != 0) {
    typename Handler::DblSuffixHandler
        suffix_handler = handler_.OnDblSuffix(name, kind, num_values);
    ReadSuffixValues<DoubleReader>(num_values, num_items, suffix_handler);
  } else {
    typename Handler::IntSuffixHandler
        suffix_handler = handler_.OnIntSuffix(name, kind, num_values);
    ReadSuffixValues<IntReader>(num_values, num_items, suffix_handler);
  }
}